

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuntimeObjectSystem.cpp
# Opt level: O0

void __thiscall RuntimeObjectSystem::AddPathToSourceSearch(RuntimeObjectSystem *this,char *path)

{
  mapped_type *this_00;
  Path local_40;
  char *local_18;
  char *path_local;
  RuntimeObjectSystem *this_local;
  
  local_18 = path;
  path_local = (char *)this;
  FileSystemUtils::Path::Path(&local_40,path);
  this_00 = std::
            map<FileSystemUtils::Path,_FileSystemUtils::Path,_std::less<FileSystemUtils::Path>,_std::allocator<std::pair<const_FileSystemUtils::Path,_FileSystemUtils::Path>_>_>
            ::operator[](&this->m_FoundSourceDirectoryMappings,&local_40);
  FileSystemUtils::Path::operator=(this_00,path);
  FileSystemUtils::Path::~Path(&local_40);
  return;
}

Assistant:

void RuntimeObjectSystem::AddPathToSourceSearch( const char* path )
{
    m_FoundSourceDirectoryMappings[ path ] = path;
}